

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

int ecdh_hash_function_custom(uchar *output,uchar *x,uchar *y,void *data)

{
  void *data_local;
  uchar *y_local;
  uchar *x_local;
  uchar *output_local;
  
  *output = '\x04';
  *(undefined8 *)(output + 1) = *(undefined8 *)x;
  *(undefined8 *)(output + 9) = *(undefined8 *)(x + 8);
  *(undefined8 *)(output + 0x11) = *(undefined8 *)(x + 0x10);
  *(undefined8 *)(output + 0x19) = *(undefined8 *)(x + 0x18);
  *(undefined8 *)(output + 0x21) = *(undefined8 *)y;
  *(undefined8 *)(output + 0x29) = *(undefined8 *)(y + 8);
  *(undefined8 *)(output + 0x31) = *(undefined8 *)(y + 0x10);
  *(undefined8 *)(output + 0x39) = *(undefined8 *)(y + 0x18);
  return 1;
}

Assistant:

static int ecdh_hash_function_custom(unsigned char *output, const unsigned char *x, const unsigned char *y, void *data) {
    (void)data;
    /* Save x and y as uncompressed public key */
    output[0] = 0x04;
    memcpy(output + 1, x, 32);
    memcpy(output + 33, y, 32);
    return 1;
}